

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O2

int bsplitcb(const_bstring str,uchar splitChar,int pos,_func_int_void_ptr_int_int *cb,void *parm)

{
  ulong uVar1;
  uchar *puVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  
  iVar4 = -1;
  if ((((-1 < pos) && (str != (const_bstring)0x0)) && (cb != (_func_int_void_ptr_int_int *)0x0)) &&
     (uVar3 = str->slen, pos <= (int)uVar3)) {
    do {
      uVar5 = (ulong)(uint)pos;
      uVar6 = pos;
      if (pos <= (int)uVar3) {
        uVar6 = uVar3;
      }
      do {
        if ((int)uVar3 <= (int)uVar5) goto LAB_001305b4;
        uVar1 = uVar5 + 1;
        puVar2 = str->data + uVar5;
        uVar5 = uVar1;
      } while (*puVar2 != splitChar);
      uVar6 = (int)uVar1 - 1;
LAB_001305b4:
      iVar4 = (*cb)(parm,pos,uVar6 - pos);
      if (iVar4 < 0) {
        return iVar4;
      }
      pos = uVar6 + 1;
      uVar3 = str->slen;
    } while ((int)uVar6 < (int)uVar3);
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int bsplitcb (const_bstring str, unsigned char splitChar, int pos,
	int (* cb) (void * parm, int ofs, int len), void * parm) {
int i, p, ret;

	if (cb == NULL || str == NULL || pos < 0 || pos > str->slen)
		return BSTR_ERR;

	p = pos;
	do {
		for (i=p; i < str->slen; i++) {
			if (str->data[i] == splitChar) break;
		}
		if ((ret = cb (parm, p, i - p)) < 0) return ret;
		p = i + 1;
	} while (p <= str->slen);
	return BSTR_OK;
}